

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O1

void GradientUnfilter_SSE2(uint8_t *prev,uint8_t *in,uint8_t *out,int width)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  unkuint9 Var25;
  undefined1 auVar26 [11];
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  ulong uVar37;
  uint uVar38;
  byte bVar39;
  int iVar40;
  short sVar41;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  undefined1 auVar42 [16];
  short sVar50;
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  ulong uVar52;
  long lVar54;
  
  if (prev != (uint8_t *)0x0) {
    *out = *prev + *in;
    if (1 < width) {
      uVar38 = width - 1;
      if ((uVar38 & 0x7ffffff8) == 0) {
        uVar37 = 0;
      }
      else {
        auVar42 = ZEXT116(*out);
        uVar37 = 0;
        do {
          uVar1 = *(ulong *)(prev + uVar37 + 1);
          uVar2 = *(ulong *)(prev + uVar37);
          auVar4._8_6_ = 0;
          auVar4._0_8_ = uVar1;
          auVar4[0xe] = (char)(uVar1 >> 0x38);
          auVar7._8_4_ = 0;
          auVar7._0_8_ = uVar1;
          auVar7[0xc] = (char)(uVar1 >> 0x30);
          auVar7._13_2_ = auVar4._13_2_;
          auVar10._8_4_ = 0;
          auVar10._0_8_ = uVar1;
          auVar10._12_3_ = auVar7._12_3_;
          auVar13._8_2_ = 0;
          auVar13._0_8_ = uVar1;
          auVar13[10] = (char)(uVar1 >> 0x28);
          auVar13._11_4_ = auVar10._11_4_;
          auVar16._8_2_ = 0;
          auVar16._0_8_ = uVar1;
          auVar16._10_5_ = auVar13._10_5_;
          auVar19[8] = (char)(uVar1 >> 0x20);
          auVar19._0_8_ = uVar1;
          auVar19._9_6_ = auVar16._9_6_;
          auVar24._7_8_ = 0;
          auVar24._0_7_ = auVar19._8_7_;
          Var25 = CONCAT81(SUB158(auVar24 << 0x40,7),(char)(uVar1 >> 0x18));
          auVar31._9_6_ = 0;
          auVar31._0_9_ = Var25;
          auVar26._1_10_ = SUB1510(auVar31 << 0x30,5);
          auVar26[0] = (char)(uVar1 >> 0x10);
          auVar32._11_4_ = 0;
          auVar32._0_11_ = auVar26;
          auVar22[2] = (char)(uVar1 >> 8);
          auVar22._0_2_ = (ushort)uVar1;
          auVar22._3_12_ = SUB1512(auVar32 << 0x20,3);
          auVar5._8_6_ = 0;
          auVar5._0_8_ = uVar2;
          auVar5[0xe] = (char)(uVar2 >> 0x38);
          auVar8._8_4_ = 0;
          auVar8._0_8_ = uVar2;
          auVar8[0xc] = (char)(uVar2 >> 0x30);
          auVar8._13_2_ = auVar5._13_2_;
          auVar11._8_4_ = 0;
          auVar11._0_8_ = uVar2;
          auVar11._12_3_ = auVar8._12_3_;
          auVar14._8_2_ = 0;
          auVar14._0_8_ = uVar2;
          auVar14[10] = (char)(uVar2 >> 0x28);
          auVar14._11_4_ = auVar11._11_4_;
          auVar17._8_2_ = 0;
          auVar17._0_8_ = uVar2;
          auVar17._10_5_ = auVar14._10_5_;
          auVar20[8] = (char)(uVar2 >> 0x20);
          auVar20._0_8_ = uVar2;
          auVar20._9_6_ = auVar17._9_6_;
          auVar27._7_8_ = 0;
          auVar27._0_7_ = auVar20._8_7_;
          Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),(char)(uVar2 >> 0x18));
          auVar33._9_6_ = 0;
          auVar33._0_9_ = Var28;
          auVar29._1_10_ = SUB1510(auVar33 << 0x30,5);
          auVar29[0] = (char)(uVar2 >> 0x10);
          auVar34._11_4_ = 0;
          auVar34._0_11_ = auVar29;
          auVar23[2] = (char)(uVar2 >> 8);
          auVar23._0_2_ = (ushort)uVar2;
          auVar23._3_12_ = SUB1512(auVar34 << 0x20,3);
          uVar3 = *(undefined8 *)(in + uVar37 + 1);
          iVar40 = 8;
          auVar51 = (undefined1  [16])0x0;
          auVar53 = ZEXT416(0xff);
          do {
            sVar41 = auVar42._0_2_ + (((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff));
            sVar44 = auVar42._2_2_ + (auVar22._2_2_ - auVar23._2_2_);
            sVar45 = auVar42._4_2_ + (auVar26._0_2_ - auVar29._0_2_);
            sVar46 = auVar42._6_2_ + ((short)Var25 - (short)Var28);
            sVar47 = auVar42._8_2_ + (auVar19._8_2_ - auVar20._8_2_);
            sVar48 = auVar42._10_2_ + (auVar13._10_2_ - auVar14._10_2_);
            sVar49 = auVar42._12_2_ + (auVar7._12_2_ - auVar8._12_2_);
            sVar50 = auVar42._14_2_ + ((auVar4._13_2_ >> 8) - (auVar5._13_2_ >> 8));
            auVar55[0] = ((0 < sVar41) * (sVar41 < 0x100) * (char)sVar41 - (0xff < sVar41)) +
                         (char)uVar3;
            auVar55[1] = ((0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44)) +
                         (char)((ulong)uVar3 >> 8);
            auVar55[2] = ((0 < sVar45) * (sVar45 < 0x100) * (char)sVar45 - (0xff < sVar45)) +
                         (char)((ulong)uVar3 >> 0x10);
            auVar55[3] = ((0 < sVar46) * (sVar46 < 0x100) * (char)sVar46 - (0xff < sVar46)) +
                         (char)((ulong)uVar3 >> 0x18);
            auVar55[4] = ((0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47)) +
                         (char)((ulong)uVar3 >> 0x20);
            auVar55[5] = ((0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48)) +
                         (char)((ulong)uVar3 >> 0x28);
            auVar55[6] = ((0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49)) +
                         (char)((ulong)uVar3 >> 0x30);
            auVar55[7] = ((0 < sVar50) * (sVar50 < 0x100) * (char)sVar50 - (0xff < sVar50)) +
                         (char)((ulong)uVar3 >> 0x38);
            auVar55._8_8_ = 0;
            auVar55 = auVar55 & auVar53;
            auVar42 = auVar55;
            if (iVar40 != 1) {
              auVar43._0_8_ = auVar55._0_8_ << 8;
              auVar43._8_8_ = auVar55._8_8_ << 8;
              lVar54 = auVar53._8_8_;
              uVar52 = auVar53._0_8_;
              auVar53._0_8_ = uVar52 << 8;
              auVar53._8_8_ = lVar54 << 8 | uVar52 >> 0x38;
              auVar6[0xd] = 0;
              auVar6._0_13_ = auVar43._0_13_;
              auVar6[0xe] = auVar55[6];
              auVar9[0xc] = auVar55[5];
              auVar9._0_12_ = auVar43._0_12_;
              auVar9._13_2_ = auVar6._13_2_;
              auVar12[0xb] = 0;
              auVar12._0_11_ = auVar43._0_11_;
              auVar12._12_3_ = auVar9._12_3_;
              auVar15[10] = auVar55[4];
              auVar15._0_10_ = auVar43._0_10_;
              auVar15._11_4_ = auVar12._11_4_;
              auVar18[9] = 0;
              auVar18._0_9_ = auVar43._0_9_;
              auVar18._10_5_ = auVar15._10_5_;
              auVar21[8] = auVar55[3];
              auVar21._0_8_ = auVar43._0_8_;
              auVar21._9_6_ = auVar18._9_6_;
              auVar30._7_8_ = 0;
              auVar30._0_7_ = auVar21._8_7_;
              auVar35._1_8_ = SUB158(auVar30 << 0x40,7);
              auVar35[0] = auVar55[2];
              auVar35._9_6_ = 0;
              auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
              auVar36[0] = auVar55[1];
              auVar36._11_4_ = 0;
              auVar42._1_12_ = SUB1512(auVar36 << 0x20,3);
              auVar42[0] = auVar55[0];
              auVar42._13_3_ = 0;
              auVar42 = auVar42 << 0x10;
            }
            auVar51 = auVar51 | auVar55;
            iVar40 = iVar40 + -1;
          } while (iVar40 != 0);
          auVar42 = auVar42 >> 0x38;
          *(long *)(out + uVar37 + 1) = auVar51._0_8_;
          uVar37 = uVar37 + 8;
        } while (uVar37 < (uVar38 & 0x7ffffff8));
      }
      if ((int)uVar37 < (int)uVar38) {
        uVar37 = uVar37 & 0xffffffff;
        bVar39 = out[uVar37];
        do {
          iVar40 = ((uint)bVar39 + (uint)prev[uVar37 + 1]) - (uint)prev[uVar37];
          if (iVar40 < 1) {
            iVar40 = 0;
          }
          if (0xfe < iVar40) {
            iVar40 = 0xff;
          }
          bVar39 = (char)iVar40 + in[uVar37 + 1];
          out[uVar37 + 1] = bVar39;
          uVar37 = uVar37 + 1;
        } while (uVar38 != uVar37);
      }
    }
    return;
  }
  HorizontalUnfilter_SSE2((uint8_t *)0x0,in,out,width);
  return;
}

Assistant:

static void GradientUnfilter_SSE2(const uint8_t* prev, const uint8_t* in,
                                  uint8_t* out, int width) {
  if (prev == NULL) {
    HorizontalUnfilter_SSE2(NULL, in, out, width);
  } else {
    out[0] = (uint8_t)(in[0] + prev[0]);  // predict from above
    GradientPredictInverse_SSE2(in + 1, prev + 1, out + 1, width - 1);
  }
}